

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
     ::
     dynamic_push_3<density_tests::NonPolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>
               (lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                *i_queue)

{
  NonPolymorphicBase move_source;
  NonPolymorphicBase copy_source;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  undefined8 local_20;
  undefined8 local_18;
  runtime_type local_10;
  
  local_10.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::NonPolymorphicBase>
       ::s_table;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::dyn_push(i_queue,&local_10);
  local_18._0_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)((long)&local_18 + 4));
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::dyn_push_copy(i_queue,&local_10,&local_18);
  local_20._0_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)((long)&local_20 + 4));
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::dyn_push_move(i_queue,&local_10,&local_20);
  NonPolymorphicBase::~NonPolymorphicBase((NonPolymorphicBase *)&local_20);
  NonPolymorphicBase::~NonPolymorphicBase((NonPolymorphicBase *)&local_18);
  return;
}

Assistant:

static void dynamic_push_3(QUEUE & i_queue)
        {
            auto const type = QUEUE::runtime_type::template make<ELEMENT>();

            i_queue.dyn_push(type);

            ELEMENT copy_source;
            i_queue.dyn_push_copy(type, &copy_source);

            ELEMENT move_source;
            i_queue.dyn_push_move(type, &move_source);
        }